

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qauthenticator.cpp
# Opt level: O2

gss_name_t qGSsapiGetServiceName(QStringView host)

{
  OM_uint32 majStat;
  gss_name_t pgVar1;
  long in_FS_OFFSET;
  OM_uint32 minStat;
  gss_name_t importedName;
  OM_uint32 local_9c;
  QArrayDataPointer<char> local_98;
  QStringBuilder<const_char_(&)[7],_QByteArray> local_78;
  QArrayDataPointer<char> local_58;
  QStringView local_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.ptr = &DAT_aaaaaaaaaaaaaaaa;
  QStringView::toLocal8Bit((QByteArray *)&local_98,&local_40);
  local_78.b.d.size = local_98.size;
  local_78.b.d.ptr = local_98.ptr;
  local_78.b.d.d = local_98.d;
  local_78.a = (char (*) [7])0x242054;
  local_98.d = (Data *)0x0;
  local_98.ptr = (char *)0x0;
  local_98.size = 0;
  QStringBuilder<const_char_(&)[7],_QByteArray>::convertTo<QByteArray>
            ((QByteArray *)&local_58,&local_78);
  QArrayDataPointer<char>::~QArrayDataPointer(&local_78.b.d);
  QArrayDataPointer<char>::~QArrayDataPointer(&local_98);
  local_78.a = (char (*) [7])local_58.size;
  local_78.b.d.d = (Data *)QByteArray::data((QByteArray *)&local_58);
  local_98.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_9c = 0xaaaaaaaa;
  majStat = gss_import_name(&local_9c,&local_78,_GSS_C_NT_HOSTBASED_SERVICE,&local_98);
  pgVar1 = (gss_name_t)local_98.d;
  if (majStat != 0) {
    q_GSSAPI_error("gss_import_name error",majStat,local_9c);
    pgVar1 = (gss_name_t)0x0;
  }
  QArrayDataPointer<char>::~QArrayDataPointer(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return pgVar1;
}

Assistant:

static gss_name_t qGSsapiGetServiceName(QStringView host)
{
    QByteArray serviceName = "HTTPS@" + host.toLocal8Bit();
    gss_buffer_desc nameDesc = {static_cast<std::size_t>(serviceName.size()), serviceName.data()};

    gss_name_t importedName;
    OM_uint32 minStat;
    OM_uint32 majStat = gss_import_name(&minStat, &nameDesc,
                              GSS_C_NT_HOSTBASED_SERVICE, &importedName);

    if (majStat != GSS_S_COMPLETE) {
        q_GSSAPI_error("gss_import_name error", majStat, minStat);
        return nullptr;
    }
    return importedName;
}